

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::LiteBasicTest_AllLite21_Test::TestBody
          (LiteBasicTest_AllLite21_Test *this)

{
  undefined1 local_4c0 [8];
  TestMapLite message2;
  TestMapLite message1;
  LiteBasicTest_AllLite21_Test *this_local;
  
  proto2_unittest::TestMapLite::TestMapLite((TestMapLite *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestMapLite::TestMapLite((TestMapLite *)local_4c0);
  MapTestUtil::SetMapFields<proto2_unittest::TestMapLite>
            ((TestMapLite *)&message2.field_0._impl_._cached_size_);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>
            ((TestMapLite *)&message2.field_0._impl_._cached_size_);
  MapTestUtil::ExpectClear<proto2_unittest::TestMapLite>((TestMapLite *)local_4c0);
  proto2_unittest::TestMapLite::Swap
            ((TestMapLite *)&message2.field_0._impl_._cached_size_,(TestMapLite *)local_4c0);
  MapTestUtil::ExpectMapFieldsSet<proto2_unittest::TestMapLite>((TestMapLite *)local_4c0);
  MapTestUtil::ExpectClear<proto2_unittest::TestMapLite>
            ((TestMapLite *)&message2.field_0._impl_._cached_size_);
  proto2_unittest::TestMapLite::~TestMapLite((TestMapLite *)local_4c0);
  proto2_unittest::TestMapLite::~TestMapLite((TestMapLite *)&message2.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST(LiteBasicTest, AllLite21) {
  {
    // SwapWithEmpty
    proto2_unittest::TestMapLite message1, message2;

    MapTestUtil::SetMapFields(&message1);
    MapTestUtil::ExpectMapFieldsSet(message1);
    MapTestUtil::ExpectClear(message2);

    message1.Swap(&message2);
    MapTestUtil::ExpectMapFieldsSet(message2);
    MapTestUtil::ExpectClear(message1);
  }
}